

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer> __thiscall
kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::downcast<kj::_::ChainPromiseNode>
          (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this)

{
  ChainPromiseNode *pCVar1;
  long *in_RSI;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_local;
  Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer> *result;
  
  Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>::Own
            ((Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer> *)this);
  if (*in_RSI != 0) {
    pCVar1 = downcast<kj::_::ChainPromiseNode,kj::_::PromiseNode>((PromiseNode *)*in_RSI);
    this->ptr = &pCVar1->super_PromiseNode;
    *in_RSI = 0;
  }
  return (Own<kj::_::ChainPromiseNode,_kj::_::PromiseDisposer>)(ChainPromiseNode *)this;
}

Assistant:

Own<U, StaticDisposer> downcast() {
    // Downcast the pointer to Own<U>, destroying the original pointer.  If this pointer does not
    // actually point at an instance of U, the results are undefined (throws an exception in debug
    // mode if RTTI is enabled, otherwise you're on your own).

    Own<U, StaticDisposer> result;
    if (ptr != nullptr) {
      result.ptr = &kj::downcast<U>(*ptr);
      ptr = nullptr;
    }
    return result;
  }